

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_deep_copy(REF_ADJ *ref_adj_ptr,REF_ADJ original)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_ADJ pRVar5;
  REF_INT *pRVar6;
  REF_ADJ_ITEM pRVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  
  pRVar5 = (REF_ADJ)malloc(0x20);
  *ref_adj_ptr = pRVar5;
  if (pRVar5 == (REF_ADJ)0x0) {
    pcVar11 = "malloc *ref_adj_ptr of REF_ADJ_STRUCT NULL";
    uVar9 = 0x3f;
  }
  else {
    iVar1 = original->nnode;
    pRVar5->nnode = iVar1;
    uVar2 = original->nitem;
    uVar12 = (ulong)uVar2;
    pRVar5->nitem = uVar2;
    if ((long)iVar1 < 0) {
      pcVar11 = "malloc ref_adj->first of REF_INT negative";
      uVar9 = 0x45;
LAB_0010f280:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uVar9,
             "ref_adj_deep_copy",pcVar11);
      return 1;
    }
    pRVar6 = (REF_INT *)malloc((long)iVar1 << 2);
    pRVar5->first = pRVar6;
    if (pRVar6 == (REF_INT *)0x0) {
      pcVar11 = "malloc ref_adj->first of REF_INT NULL";
      uVar9 = 0x45;
    }
    else {
      if (0 < pRVar5->nnode) {
        pRVar3 = original->first;
        uVar8 = 1;
        if (1 < pRVar5->nnode) {
          uVar8 = (ulong)(uint)pRVar5->nnode;
        }
        uVar10 = 0;
        do {
          pRVar6[uVar10] = pRVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      if ((int)uVar2 < 0) {
        pcVar11 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT negative";
        uVar9 = 0x49;
        goto LAB_0010f280;
      }
      pRVar7 = (REF_ADJ_ITEM)malloc(uVar12 * 8);
      pRVar5->item = pRVar7;
      if (pRVar7 != (REF_ADJ_ITEM)0x0) {
        if (uVar12 != 0) {
          pRVar4 = original->item;
          uVar8 = 0;
          do {
            pRVar7[uVar8].ref = pRVar4[uVar8].ref;
            pRVar7[uVar8].next = pRVar4[uVar8].next;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
        pRVar5->blank = original->blank;
        return 0;
      }
      pcVar11 = "malloc ref_adj->item of REF_ADJ_ITEM_STRUCT NULL";
      uVar9 = 0x49;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",uVar9,
         "ref_adj_deep_copy",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_deep_copy(REF_ADJ *ref_adj_ptr, REF_ADJ original) {
  REF_ADJ ref_adj;
  REF_INT i;

  ref_malloc(*ref_adj_ptr, 1, REF_ADJ_STRUCT);
  ref_adj = (*ref_adj_ptr);

  ref_adj_nnode(ref_adj) = ref_adj_nnode(original);
  ref_adj_nitem(ref_adj) = ref_adj_nitem(original);

  ref_malloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
  for (i = 0; i < ref_adj_nnode(ref_adj); i++)
    ref_adj->first[i] = original->first[i];

  ref_malloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
  for (i = 0; i < ref_adj_nitem(ref_adj); i++) {
    ref_adj->item[i].ref = original->item[i].ref;
    ref_adj->item[i].next = original->item[i].next;
  }
  ref_adj->blank = original->blank;

  return REF_SUCCESS;
}